

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyCheck.c
# Opt level: O3

int Ivy_ManCheckFanoutNums(Ivy_Man_t *p)

{
  void *pvVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  
  lVar2 = (long)p->vObjs->nSize;
  if (0 < lVar2) {
    lVar3 = 0;
    uVar4 = 0;
    do {
      pvVar1 = p->vObjs->pArray[lVar3];
      if ((pvVar1 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar1 + 8) & 0xf) - 7)) {
        uVar4 = (ulong)((int)uVar4 + (uint)(*(int *)((long)pvVar1 + 0xc) == 0));
      }
      lVar3 = lVar3 + 1;
    } while (lVar2 != lVar3);
    if ((int)uVar4 != 0) {
      printf("Sequential AIG has %d dangling nodes.\n",uVar4);
      return (int)uVar4;
    }
  }
  return 0;
}

Assistant:

int Ivy_ManCheckFanoutNums( Ivy_Man_t * p )
{
    Ivy_Obj_t * pObj;
    int i, Counter = 0;
    Ivy_ManForEachObj( p, pObj, i )
        if ( Ivy_ObjIsNode(pObj) )
            Counter += (Ivy_ObjRefs(pObj) == 0);
    if ( Counter )
        printf( "Sequential AIG has %d dangling nodes.\n", Counter );
    return Counter;
}